

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

void __thiscall
el::Configuration::Configuration
          (Configuration *this,Level level,ConfigurationType configurationType,string *value)

{
  string *value_local;
  ConfigurationType configurationType_local;
  Level level_local;
  Configuration *this_local;
  
  Loggable::Loggable(&this->super_Loggable);
  (this->super_Loggable)._vptr_Loggable = (_func_int **)&PTR__Configuration_001790e0;
  this->m_level = level;
  this->m_configurationType = configurationType;
  std::__cxx11::string::string((string *)&this->m_value,(string *)value);
  return;
}

Assistant:

Configuration::Configuration(Level level, ConfigurationType configurationType, const std::string& value) :
  m_level(level),
  m_configurationType(configurationType),
  m_value(value) {
}